

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.hpp
# Opt level: O0

void __thiscall
jsoncons::csv::
basic_csv_reader<char,jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::allocator<char>>
::
basic_csv_reader<jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
          (basic_csv_reader<char,_jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<char>_>
           *this,iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *source,basic_json_visitor<char> *visitor,basic_csv_decode_options<char> *options,
          allocator<char> *alloc)

{
  function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *in_RCX;
  basic_csv_decode_options<char> *in_RDX;
  basic_json_visitor<char> *in_RSI;
  iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  allocator<char> *in_R8;
  basic_csv_reader<char,_jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<char>_>
  *unaff_retaddr;
  
  std::function<bool(jsoncons::csv::csv_errc,jsoncons::ser_context_const&)>::
  function<jsoncons::csv::default_csv_parsing,void>(in_RCX,(default_csv_parsing *)in_RDX);
  basic_csv_reader<jsoncons::iterator_source<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
            (unaff_retaddr,in_RDI,in_RSI,in_RDX,in_RCX,in_R8);
  std::function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)>::~function
            ((function<bool_(jsoncons::csv::csv_errc,_const_jsoncons::ser_context_&)> *)0x4a8f0f);
  return;
}

Assistant:

basic_csv_reader(Sourceable&& source,
                         basic_json_visitor<CharT>& visitor,
                         const basic_csv_decode_options<CharT>& options, 
                         const Allocator& alloc = Allocator())

            : basic_csv_reader(std::forward<Sourceable>(source), 
                               visitor, 
                               options, 
                               default_csv_parsing(),
                               alloc)
        {
        }